

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

void __thiscall Patch::Node::Node(Node *this,Deserializer *input)

{
  unique_ptr<Text,_std::default_delete<Text>_> *this_00;
  byte bVar1;
  byte *pbVar2;
  _Head_base<0UL,_Text_*,_false> _Var3;
  int iVar4;
  uint uVar5;
  pointer *__ptr;
  byte *pbVar6;
  _Head_base<0UL,_Text_*,_false> _Var7;
  default_delete<Text> *this_01;
  pointer __p_1;
  pointer __p;
  pointer *__ptr_1;
  Text *local_30;
  
  this->left = (Node *)0x0;
  this->right = (Node *)0x0;
  Point::Point(&this->old_extent,input);
  Point::Point(&this->new_extent,input);
  Point::Point(&this->old_distance_from_left_ancestor,input);
  Point::Point(&this->new_distance_from_left_ancestor,input);
  this_00 = &this->old_text;
  this_01 = (default_delete<Text> *)&this->new_text;
  (this->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
  super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.super__Head_base<0UL,_Text_*,_false>.
  _M_head_impl = (Text *)0x0;
  (this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
  super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.super__Head_base<0UL,_Text_*,_false>.
  _M_head_impl = (Text *)0x0;
  pbVar2 = *(byte **)input;
  if ((*(int *)(input + 8) - (int)pbVar2 & 0xfffffffcU) == 0) {
    *(byte **)input = pbVar2 + 4;
LAB_0016cf4a:
    _Var7._M_head_impl =
         (this_00->_M_t).super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
         super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
         super__Head_base<0UL,_Text_*,_false>._M_head_impl;
    (this_00->_M_t).super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
    super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.super__Head_base<0UL,_Text_*,_false>.
    _M_head_impl = (Text *)0x0;
    if (_Var7._M_head_impl != (Text *)0x0) {
      std::default_delete<Text>::operator()((default_delete<Text> *)this_00,_Var7._M_head_impl);
    }
    pbVar2 = *(byte **)input;
    if ((*(int *)(input + 8) - (int)pbVar2 & 0xfffffffcU) == 0) {
      uVar5 = 0;
    }
    else {
      iVar4 = 0;
      uVar5 = 0;
      pbVar6 = pbVar2;
      do {
        bVar1 = *pbVar6;
        pbVar6 = pbVar6 + 1;
        uVar5 = uVar5 | (uint)bVar1 << ((byte)iVar4 & 0x1f);
        iVar4 = iVar4 + 8;
      } while (iVar4 != 0x20);
    }
    *(byte **)input = pbVar2 + 4;
  }
  else {
    iVar4 = 0;
    uVar5 = 0;
    pbVar6 = pbVar2;
    do {
      bVar1 = *pbVar6;
      pbVar6 = pbVar6 + 1;
      uVar5 = uVar5 | (uint)bVar1 << ((byte)iVar4 & 0x1f);
      iVar4 = iVar4 + 8;
    } while (iVar4 != 0x20);
    *(byte **)input = pbVar2 + 4;
    if (uVar5 == 0) goto LAB_0016cf4a;
    _Var3._M_head_impl = (Text *)operator_new(0x38);
    Text::Text(_Var3._M_head_impl,input);
    local_30 = (Text *)0x0;
    _Var7._M_head_impl =
         (this_00->_M_t).super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
         super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
         super__Head_base<0UL,_Text_*,_false>._M_head_impl;
    (this_00->_M_t).super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
    super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.super__Head_base<0UL,_Text_*,_false>.
    _M_head_impl = _Var3._M_head_impl;
    if (_Var7._M_head_impl != (Text *)0x0) {
      std::default_delete<Text>::operator()((default_delete<Text> *)this_00,_Var7._M_head_impl);
    }
    if (local_30 != (Text *)0x0) {
      std::default_delete<Text>::operator()((default_delete<Text> *)&local_30,local_30);
    }
    uVar5 = 0;
  }
  this->old_text_size_ = uVar5;
  pbVar2 = *(byte **)input;
  if ((*(int *)(input + 8) - (int)pbVar2 & 0xfffffffcU) == 0) {
    *(byte **)input = pbVar2 + 4;
  }
  else {
    iVar4 = 0;
    uVar5 = 0;
    pbVar6 = pbVar2;
    do {
      bVar1 = *pbVar6;
      pbVar6 = pbVar6 + 1;
      uVar5 = uVar5 | (uint)bVar1 << ((byte)iVar4 & 0x1f);
      iVar4 = iVar4 + 8;
    } while (iVar4 != 0x20);
    *(byte **)input = pbVar2 + 4;
    if (uVar5 != 0) {
      _Var3._M_head_impl = (Text *)operator_new(0x38);
      Text::Text(_Var3._M_head_impl,input);
      local_30 = (Text *)0x0;
      _Var7._M_head_impl =
           (((unique_ptr<Text,_std::default_delete<Text>_> *)this_01)->_M_t).
           super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
           super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
           super__Head_base<0UL,_Text_*,_false>._M_head_impl;
      (((unique_ptr<Text,_std::default_delete<Text>_> *)this_01)->_M_t).
      super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
      super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
      super__Head_base<0UL,_Text_*,_false>._M_head_impl = _Var3._M_head_impl;
      if (_Var7._M_head_impl != (Text *)0x0) {
        std::default_delete<Text>::operator()(this_01,_Var7._M_head_impl);
      }
      if (local_30 == (Text *)0x0) {
        return;
      }
      this_01 = (default_delete<Text> *)&local_30;
      _Var7._M_head_impl = local_30;
      goto LAB_0016d02e;
    }
  }
  _Var7._M_head_impl =
       (((unique_ptr<Text,_std::default_delete<Text>_> *)this_01)->_M_t).
       super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
       super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
       super__Head_base<0UL,_Text_*,_false>._M_head_impl;
  (((unique_ptr<Text,_std::default_delete<Text>_> *)this_01)->_M_t).
  super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
  super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.super__Head_base<0UL,_Text_*,_false>.
  _M_head_impl = (Text *)0x0;
  if (_Var7._M_head_impl == (Text *)0x0) {
    return;
  }
LAB_0016d02e:
  std::default_delete<Text>::operator()(this_01,_Var7._M_head_impl);
  return;
}

Assistant:

Node(Deserializer &input) :
    left{nullptr},
    right{nullptr},
    old_extent{input},
    new_extent{input},
    old_distance_from_left_ancestor{input},
    new_distance_from_left_ancestor{input} {

    if (input.read<uint32_t>()) {
      old_text = unique_ptr<Text>{new Text{input}};
      old_text_size_ = 0;
    } else {
      old_text = nullptr;
      old_text_size_ = input.read<uint32_t>();
    }

    if (input.read<uint32_t>()) {
      new_text = unique_ptr<Text>{new Text{input}};
    } else {
      new_text = nullptr;
    }
  }